

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zher2.c
# Opt level: O0

int zher2_(char *uplo,integer *n,doublecomplex *alpha,doublecomplex *x,integer *incx,
          doublecomplex *y,integer *incy,doublecomplex *a,integer *lda)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int local_d8;
  int local_d0;
  int local_cc;
  integer ky;
  integer kx;
  integer jy;
  integer jx;
  integer iy;
  integer ix;
  integer j;
  integer i;
  doublecomplex temp2;
  doublecomplex temp1;
  integer info;
  doublecomplex z__4;
  doublecomplex z__3;
  doublecomplex z__2;
  doublecomplex z__1;
  doublereal d__1;
  doublecomplex *y_local;
  integer *incx_local;
  doublecomplex *x_local;
  doublecomplex *alpha_local;
  integer *n_local;
  char *uplo_local;
  
  temp1.i._4_4_ = 0;
  iVar5 = strncmp(uplo,"U",1);
  if ((iVar5 == 0) || (iVar5 = strncmp(uplo,"L",1), iVar5 == 0)) {
    if (*n < 0) {
      temp1.i._4_4_ = 2;
    }
    else if (*incx == 0) {
      temp1.i._4_4_ = 5;
    }
    else if (*incy == 0) {
      temp1.i._4_4_ = 7;
    }
    else {
      if (*n < 2) {
        local_d8 = 1;
      }
      else {
        local_d8 = *n;
      }
      if (*lda < local_d8) {
        temp1.i._4_4_ = 9;
      }
    }
  }
  else {
    temp1.i._4_4_ = 1;
  }
  if (temp1.i._4_4_ == 0) {
    if ((*n != 0) &&
       ((((alpha->r != 0.0 || (NAN(alpha->r))) || (alpha->i != 0.0)) || (NAN(alpha->i))))) {
      if ((*incx != 1) || (*incy != 1)) {
        if (*incx < 1) {
          local_cc = 1 - (*n + -1) * *incx;
        }
        else {
          local_cc = 1;
        }
        if (*incy < 1) {
          local_d0 = 1 - (*n + -1) * *incy;
        }
        else {
          local_d0 = 1;
        }
        kx = local_cc;
        ky = local_d0;
      }
      iVar5 = strncmp(uplo,"U",1);
      if (iVar5 == 0) {
        if ((*incx == 1) && (*incy == 1)) {
          for (iy = 1; iy <= *n; iy = iy + 1) {
            if ((((x[iy + -1].r != 0.0) || (NAN(x[iy + -1].r))) || (x[iy + -1].i != 0.0)) ||
               (((NAN(x[iy + -1].i) || (y[iy + -1].r != 0.0)) ||
                ((NAN(y[iy + -1].r) || ((y[iy + -1].i != 0.0 || (NAN(y[iy + -1].i))))))))) {
              d_cnjg((doublecomplex *)&z__3.i,y + (iy + -1));
              dVar6 = alpha->r * z__3.i + -(alpha->i * z__2.r);
              dVar7 = alpha->r * z__2.r + alpha->i * z__3.i;
              z__3.i = alpha->r * x[iy + -1].r + -(alpha->i * x[iy + -1].i);
              z__2.r = alpha->r * x[iy + -1].i + alpha->i * x[iy + -1].r;
              temp1.r = dVar7;
              z__2.i = dVar6;
              d_cnjg((doublecomplex *)&z__2.i,(doublecomplex *)&z__3.i);
              for (ix = 1; ix <= iy + -1; ix = ix + 1) {
                dVar8 = x[ix + -1].r;
                dVar1 = x[ix + -1].i;
                dVar2 = a[ix + -1 + (iy + -1) * *lda].i;
                dVar3 = y[ix + -1].r;
                dVar4 = y[ix + -1].i;
                a[ix + -1 + (iy + -1) * *lda].r =
                     a[ix + -1 + (iy + -1) * *lda].r +
                     x[ix + -1].r * dVar6 + -(x[ix + -1].i * temp1.r) +
                     y[ix + -1].r * z__2.i + -(y[ix + -1].i * dVar7);
                a[ix + -1 + (iy + -1) * *lda].i =
                     dVar2 + dVar8 * temp1.r + dVar1 * dVar6 + dVar3 * dVar7 + dVar4 * z__2.i;
              }
              z__3.i = x[iy + -1].r * dVar6 + -(x[iy + -1].i * temp1.r);
              z__2.r = x[iy + -1].r * temp1.r + x[iy + -1].i * dVar6;
              z__3.r = y[iy + -1].r * dVar7 + y[iy + -1].i * z__2.i;
              z__2.i = z__3.i + y[iy + -1].r * z__2.i + -(y[iy + -1].i * dVar7);
              a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r + z__2.i;
              a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            }
            else {
              a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r;
              a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            }
          }
        }
        else {
          for (iy = 1; iy <= *n; iy = iy + 1) {
            if ((((((x[kx + -1].r != 0.0) || (NAN(x[kx + -1].r))) || (x[kx + -1].i != 0.0)) ||
                 ((NAN(x[kx + -1].i) || (y[ky + -1].r != 0.0)))) || (NAN(y[ky + -1].r))) ||
               ((y[ky + -1].i != 0.0 || (NAN(y[ky + -1].i))))) {
              d_cnjg((doublecomplex *)&z__3.i,y + (ky + -1));
              dVar6 = alpha->r * z__3.i + -(alpha->i * z__2.r);
              dVar7 = alpha->r * z__2.r + alpha->i * z__3.i;
              z__3.i = alpha->r * x[kx + -1].r + -(alpha->i * x[kx + -1].i);
              z__2.r = alpha->r * x[kx + -1].i + alpha->i * x[kx + -1].r;
              temp1.r = dVar7;
              z__2.i = dVar6;
              d_cnjg((doublecomplex *)&z__2.i,(doublecomplex *)&z__3.i);
              jx = local_cc;
              jy = local_d0;
              for (ix = 1; ix <= iy + -1; ix = ix + 1) {
                dVar8 = x[jx + -1].r;
                dVar1 = x[jx + -1].i;
                dVar2 = a[ix + -1 + (iy + -1) * *lda].i;
                dVar3 = y[jy + -1].r;
                dVar4 = y[jy + -1].i;
                a[ix + -1 + (iy + -1) * *lda].r =
                     a[ix + -1 + (iy + -1) * *lda].r +
                     x[jx + -1].r * dVar6 + -(x[jx + -1].i * temp1.r) +
                     y[jy + -1].r * z__2.i + -(y[jy + -1].i * dVar7);
                a[ix + -1 + (iy + -1) * *lda].i =
                     dVar2 + dVar8 * temp1.r + dVar1 * dVar6 + dVar3 * dVar7 + dVar4 * z__2.i;
                jx = *incx + jx;
                jy = *incy + jy;
              }
              z__3.i = x[kx + -1].r * dVar6 + -(x[kx + -1].i * temp1.r);
              z__2.r = x[kx + -1].r * temp1.r + x[kx + -1].i * dVar6;
              z__3.r = y[ky + -1].r * dVar7 + y[ky + -1].i * z__2.i;
              z__2.i = z__3.i + y[ky + -1].r * z__2.i + -(y[ky + -1].i * dVar7);
              a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r + z__2.i;
              a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            }
            else {
              a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r;
              a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            }
            kx = *incx + kx;
            ky = *incy + ky;
          }
        }
      }
      else if ((*incx == 1) && (*incy == 1)) {
        for (iy = 1; iy <= *n; iy = iy + 1) {
          if (((((x[iy + -1].r != 0.0) || (NAN(x[iy + -1].r))) || (x[iy + -1].i != 0.0)) ||
              ((NAN(x[iy + -1].i) || (y[iy + -1].r != 0.0)))) ||
             ((NAN(y[iy + -1].r) || ((y[iy + -1].i != 0.0 || (NAN(y[iy + -1].i))))))) {
            d_cnjg((doublecomplex *)&z__3.i,y + (iy + -1));
            dVar7 = alpha->r * z__3.i + -(alpha->i * z__2.r);
            dVar8 = alpha->r * z__2.r + alpha->i * z__3.i;
            z__3.i = alpha->r * x[iy + -1].r + -(alpha->i * x[iy + -1].i);
            z__2.r = alpha->r * x[iy + -1].i + alpha->i * x[iy + -1].r;
            temp1.r = dVar8;
            z__2.i = dVar7;
            d_cnjg((doublecomplex *)&z__2.i,(doublecomplex *)&z__3.i);
            dVar6 = z__2.i;
            z__3.i = x[iy + -1].r * dVar7 + -(x[iy + -1].i * temp1.r);
            z__2.r = x[iy + -1].r * temp1.r + x[iy + -1].i * dVar7;
            z__3.r = y[iy + -1].r * dVar8 + y[iy + -1].i * z__2.i;
            z__2.i = z__3.i + y[iy + -1].r * z__2.i + -(y[iy + -1].i * dVar8);
            a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r + z__2.i;
            a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            iVar5 = iy;
            while (ix = iVar5 + 1, ix <= *n) {
              z__3.r = x[iVar5].r * temp1.r + x[iVar5].i * dVar7;
              z__3.i = a[iVar5 + (iy + -1) * *lda].r + x[iVar5].r * dVar7 + -(x[iVar5].i * temp1.r);
              z__2.r = a[iVar5 + (iy + -1) * *lda].i + z__3.r;
              dVar1 = y[iVar5].r;
              dVar2 = y[iVar5].i;
              z__2.i = z__3.i + y[iVar5].r * dVar6 + -(y[iVar5].i * dVar8);
              a[iVar5 + (iy + -1) * *lda].r = z__2.i;
              a[iVar5 + (iy + -1) * *lda].i = z__2.r + dVar1 * dVar8 + dVar2 * dVar6;
              iVar5 = ix;
            }
          }
          else {
            a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r;
            a[iy + -1 + (iy + -1) * *lda].i = 0.0;
          }
        }
      }
      else {
        for (iy = 1; iy <= *n; iy = iy + 1) {
          if ((((x[kx + -1].r != 0.0) || (NAN(x[kx + -1].r))) || (x[kx + -1].i != 0.0)) ||
             (((NAN(x[kx + -1].i) || (y[ky + -1].r != 0.0)) ||
              ((NAN(y[ky + -1].r) || ((y[ky + -1].i != 0.0 || (NAN(y[ky + -1].i))))))))) {
            d_cnjg((doublecomplex *)&z__3.i,y + (ky + -1));
            dVar7 = alpha->r * z__3.i + -(alpha->i * z__2.r);
            dVar8 = alpha->r * z__2.r + alpha->i * z__3.i;
            z__3.i = alpha->r * x[kx + -1].r + -(alpha->i * x[kx + -1].i);
            z__2.r = alpha->r * x[kx + -1].i + alpha->i * x[kx + -1].r;
            temp1.r = dVar8;
            z__2.i = dVar7;
            d_cnjg((doublecomplex *)&z__2.i,(doublecomplex *)&z__3.i);
            dVar6 = z__2.i;
            z__3.i = x[kx + -1].r * dVar7 + -(x[kx + -1].i * temp1.r);
            z__2.r = x[kx + -1].r * temp1.r + x[kx + -1].i * dVar7;
            z__3.r = y[ky + -1].r * dVar8 + y[ky + -1].i * z__2.i;
            z__2.i = z__3.i + y[ky + -1].r * z__2.i + -(y[ky + -1].i * dVar8);
            a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r + z__2.i;
            a[iy + -1 + (iy + -1) * *lda].i = 0.0;
            jx = kx;
            jy = ky;
            iVar5 = iy;
            while (ix = iVar5 + 1, ix <= *n) {
              jx = *incx + jx;
              jy = *incy + jy;
              z__3.r = x[jx + -1].r * temp1.r + x[jx + -1].i * dVar7;
              z__3.i = a[iVar5 + (iy + -1) * *lda].r +
                       x[jx + -1].r * dVar7 + -(x[jx + -1].i * temp1.r);
              z__2.r = a[iVar5 + (iy + -1) * *lda].i + z__3.r;
              dVar1 = y[jy + -1].r;
              dVar2 = y[jy + -1].i;
              z__2.i = z__3.i + y[jy + -1].r * dVar6 + -(y[jy + -1].i * dVar8);
              a[iVar5 + (iy + -1) * *lda].r = z__2.i;
              a[iVar5 + (iy + -1) * *lda].i = z__2.r + dVar1 * dVar8 + dVar2 * dVar6;
              iVar5 = ix;
            }
          }
          else {
            a[iy + -1 + (iy + -1) * *lda].r = a[iy + -1 + (iy + -1) * *lda].r;
            a[iy + -1 + (iy + -1) * *lda].i = 0.0;
          }
          kx = *incx + kx;
          ky = *incy + ky;
        }
      }
    }
  }
  else {
    input_error("ZHER2 ",(int *)((long)&temp1.i + 4));
  }
  return 0;
}

Assistant:

int zher2_(char *uplo, integer *n, doublecomplex *alpha, 
	doublecomplex *x, integer *incx, doublecomplex *y, integer *incy, 
	doublecomplex *a, integer *lda)
{


    /* System generated locals */

    doublereal d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp1, temp2;
    integer i, j;
    integer ix, iy, jx, jy, kx, ky;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZHER2  performs the hermitian rank 2 operation   

       A := alpha*x*conjg( y' ) + conjg( alpha )*y*conjg( x' ) + A,   

    where alpha is a scalar, x and y are n element vectors and A is an n 
  
    by n hermitian matrix.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the upper or lower   
             triangular part of the array A is to be referenced as   
             follows:   

                UPLO = 'U' or 'u'   Only the upper triangular part of A   
                                    is to be referenced.   

                UPLO = 'L' or 'l'   Only the lower triangular part of A   
                                    is to be referenced.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCY ) ).   
             Before entry, the incremented array Y must contain the n   
             element vector y.   
             Unchanged on exit.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular part of the hermitian matrix and the strictly   
             lower triangular part of A is not referenced. On exit, the   
             upper triangular part of the array A is overwritten by the   
             upper triangular part of the updated matrix.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular part of the hermitian matrix and the strictly   
             upper triangular part of A is not referenced. On exit, the   
             lower triangular part of the array A is overwritten by the   
             lower triangular part of the updated matrix.   
             Note that the imaginary parts of the diagonal elements need 
  
             not be set, they are assumed to be zero, and on exit they   
             are set to zero.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if (*n < 0) {
	info = 2;
    } else if (*incx == 0) {
	info = 5;
    } else if (*incy == 0) {
	info = 7;
    } else if (*lda < max(1,*n)) {
	info = 9;
    }
    if (info != 0) {
	input_error("ZHER2 ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || (alpha->r == 0. && alpha->i == 0.)) {
	return 0;
    }

/*     Set up the start points in X and Y if the increments are not both 
  
       unity. */

    if (*incx != 1 || *incy != 1) {
	if (*incx > 0) {
	    kx = 1;
	} else {
	    kx = 1 - (*n - 1) * *incx;
	}
	if (*incy > 0) {
	    ky = 1;
	} else {
	    ky = 1 - (*n - 1) * *incy;
	}
	jx = kx;
	jy = ky;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through the triangular part   
       of A. */

    if (strncmp(uplo, "U", 1)==0) {

/*        Form  A  when A is stored in the upper triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L10: */
		    }
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L20: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    ix = kx;
		    iy = ky;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
			ix += *incx;
			iy += *incy;
/* L30: */
		    }
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L40: */
	    }
	}
    } else {

/*        Form  A  when A is stored in the lower triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    for (i = j + 1; i <= *n; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L50: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    ix = jx;
		    iy = jy;
		    for (i = j + 1; i <= *n; ++i) {
			ix += *incx;
			iy += *incy;
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L70: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L80: */
	    }
	}
    }

    return 0;

/*     End of ZHER2 . */

}